

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O3

shared_ptr<const_bssl::ParsedCertificate>
bssl::anon_unknown_20::OCSPParseCertificate(string_view der)

{
  element_type *extraout_RAX;
  uint8_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_bssl::ParsedCertificate> sVar1;
  CertErrors errors;
  ParseCertificateOptions local_39;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_38;
  CertErrors local_30;
  
  CertErrors::CertErrors(&local_30);
  local_38._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new(in_RDX,(size_t)der._M_str,(CRYPTO_BUFFER_POOL *)0x0);
  local_39.allow_invalid_serial_numbers = false;
  ParsedCertificate::Create
            ((ParsedCertificate *)der._M_len,(UniquePtr<CRYPTO_BUFFER> *)&local_38,&local_39,
             &local_30);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
  CertErrors::~CertErrors(&local_30);
  sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       extraout_RAX;
  return (shared_ptr<const_bssl::ParsedCertificate>)
         sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ParsedCertificate> OCSPParseCertificate(
    std::string_view der) {
  ParseCertificateOptions parse_options;
  parse_options.allow_invalid_serial_numbers = true;

  // The objects returned by this function only last for the duration of a
  // single certificate verification, so there is no need to pool them to save
  // memory.
  //
  // TODO(eroman): Swallows the parsing errors. However uses a permissive
  // parsing model.
  CertErrors errors;
  return ParsedCertificate::Create(
      bssl::UniquePtr<CRYPTO_BUFFER>(CRYPTO_BUFFER_new(
          reinterpret_cast<const uint8_t *>(der.data()), der.size(), nullptr)),
      {}, &errors);
}